

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::io::LimitingInputStream::Skip(LimitingInputStream *this,int count)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)count;
  lVar1 = this->limit_;
  if (lVar1 < lVar4) {
    if (lVar1 < 0) {
      return false;
    }
    (*this->input_->_vptr_ZeroCopyInputStream[4])();
    lVar3 = 0;
  }
  else {
    iVar2 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,count);
    if ((char)iVar2 == '\0') {
      return false;
    }
    lVar3 = this->limit_ - lVar4;
  }
  this->limit_ = lVar3;
  return lVar4 <= lVar1;
}

Assistant:

bool LimitingInputStream::Skip(int count) {
  if (count > limit_) {
    if (limit_ < 0) return false;
    input_->Skip(limit_);
    limit_ = 0;
    return false;
  } else {
    if (!input_->Skip(count)) return false;
    limit_ -= count;
    return true;
  }
}